

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_lib.c
# Opt level: O0

uchar * EVP_CIPHER_CTX_original_iv(EVP_CIPHER_CTX *ctx)

{
  int iVar1;
  long in_RDI;
  OSSL_PARAM params [2];
  uchar *v;
  int ok;
  OSSL_PARAM *in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  EVP_CIPHER *obj;
  char *in_stack_ffffffffffffff70;
  _func_int_EVP_CIPHER_CTX_ptr_int_int_void_ptr *local_18;
  
  local_18 = (_func_int_EVP_CIPHER_CTX_ptr_int_int_void_ptr *)(in_RDI + 0x18);
  memset(&stack0xffffffffffffff98,0,0x50);
  obj = (EVP_CIPHER *)&stack0xffffffffffffff98;
  OSSL_PARAM_construct_octet_ptr
            (in_stack_ffffffffffffff70,(void **)obj,(size_t)in_stack_ffffffffffffff60);
  memcpy(obj,&stack0xffffffffffffff70,0x28);
  iVar1 = evp_do_ciph_ctx_getparams(obj,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (iVar1 == 0) {
    local_18 = (_func_int_EVP_CIPHER_CTX_ptr_int_int_void_ptr *)0x0;
  }
  return (uchar *)local_18;
}

Assistant:

const unsigned char *EVP_CIPHER_CTX_original_iv(const EVP_CIPHER_CTX *ctx)
{
    int ok;
    const unsigned char *v = ctx->oiv;
    OSSL_PARAM params[2] = { OSSL_PARAM_END, OSSL_PARAM_END };

    params[0] =
        OSSL_PARAM_construct_octet_ptr(OSSL_CIPHER_PARAM_IV,
                                       (void **)&v, sizeof(ctx->oiv));
    ok = evp_do_ciph_ctx_getparams(ctx->cipher, ctx->algctx, params);

    return ok != 0 ? v : NULL;
}